

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     repeat<unsigned_short,(InstructionSet::x86::Repetition)3,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (unsigned_short *eCX,Context *context)

{
  unsigned_short uVar1;
  Context *context_local;
  unsigned_short *eCX_local;
  
  uVar1 = *eCX;
  *eCX = uVar1 - 1;
  if ((unsigned_short)(uVar1 - 1) != 0) {
    PCCompatible::FlowController::repeat_last(&context->flow_controller);
  }
  return;
}

Assistant:

void repeat(
	AddressT &eCX,
	ContextT &context
) {
	if(
		repetition == Repetition::None ||		// No repetition => stop.
		!(--eCX)								// [e]cx is zero after being decremented => stop.
	) {
		return;
	}
	if constexpr (repetition != Repetition::Rep) {
		// If this is RepE or RepNE, also test the zero flag.
		if((repetition == Repetition::RepNE) == context.flags.template flag<Flag::Zero>()) {
			return;
		}
	}
	context.flow_controller.repeat_last();
}